

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

void Omega_h::sort_by_high_index(LOs *l2lh,Write<int> *lh2h,Write<signed_char> *codes)

{
  ulong uVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  Alloc **ppAVar6;
  ulong *puVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  Alloc *pAVar11;
  long lVar12;
  ulong uVar13;
  int c;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  type f;
  size_type __dnew;
  ScopedTimer local_f2;
  ScopedTimer local_f1;
  Alloc **local_f0;
  Alloc *local_e8;
  Alloc *local_e0 [2];
  Alloc *local_d0;
  void *local_c8;
  undefined1 local_c0 [32];
  long **local_a0;
  void *local_98;
  Alloc *local_90;
  Alloc *pAStack_88;
  Alloc *local_80;
  void *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  Alloc *local_50;
  long local_48;
  ulong local_40;
  
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  ppAVar6 = (Alloc **)(plVar5 + 2);
  if ((Alloc **)*plVar5 == ppAVar6) {
    local_90 = *ppAVar6;
    pAStack_88 = (Alloc *)plVar5[3];
    local_a0 = (long **)&local_90;
  }
  else {
    local_90 = *ppAVar6;
    local_a0 = (long **)*plVar5;
  }
  local_98 = (void *)plVar5[1];
  *plVar5 = (long)ppAVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0,3,0xb4);
  pAVar11 = (Alloc *)0xf;
  if ((Alloc **)local_a0 != &local_90) {
    pAVar11 = local_90;
  }
  if (pAVar11 < (Alloc *)((long)local_e8 + (long)local_98)) {
    pAVar11 = (Alloc *)0xf;
    if (local_f0 != local_e0) {
      pAVar11 = local_e0[0];
    }
    if (pAVar11 < (Alloc *)((long)local_e8 + (long)local_98)) goto LAB_001c98d9;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_001c98d9:
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_f0);
  }
  local_d0 = (Alloc *)local_c0;
  pAVar11 = (Alloc *)(plVar5 + 2);
  if ((Alloc *)*plVar5 == pAVar11) {
    local_c0._0_8_ = pAVar11->size;
    local_c0._8_8_ = plVar5[3];
  }
  else {
    local_c0._0_8_ = pAVar11->size;
    local_d0 = (Alloc *)*plVar5;
  }
  local_c8 = (void *)plVar5[1];
  *plVar5 = (long)pAVar11;
  plVar5[1] = 0;
  *(undefined1 *)&pAVar11->size = 0;
  begin_code("sort_by_high_index",(char *)local_d0);
  if (local_d0 != (Alloc *)local_c0) {
    operator_delete(local_d0,local_c0._0_8_ + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,(ulong)((long)&local_e0[0]->size + 1));
  }
  if ((Alloc **)local_a0 != &local_90) {
    operator_delete(local_a0,(ulong)((long)&local_90->size + 1));
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  local_a0 = (long **)(l2lh->write_).shared_alloc_.alloc;
  if (((ulong)local_a0 & 1) == 0) {
    uVar10 = ((Alloc *)local_a0)->size;
  }
  else {
    uVar10 = (ulong)local_a0 >> 3;
  }
  if (((ulong)local_a0 & 7) == 0 && (Alloc *)local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (long **)(((Alloc *)local_a0)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_a0)->use_count = ((Alloc *)local_a0)->use_count + 1;
    }
  }
  local_98 = (l2lh->write_).shared_alloc_.direct_ptr;
  local_90 = (lh2h->shared_alloc_).alloc;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  pAStack_88 = (Alloc *)(lh2h->shared_alloc_).direct_ptr;
  local_80 = (codes->shared_alloc_).alloc;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_78 = (codes->shared_alloc_).direct_ptr;
  local_f0 = local_e0;
  local_50 = (Alloc *)0x5d;
  ppAVar6 = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_f0,(ulong)&local_50);
  pAVar11 = local_50;
  local_e0[0] = local_50;
  local_f0 = ppAVar6;
  memcpy(ppAVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_e8 = pAVar11;
  *(undefined1 *)((long)ppAVar6 + (long)pAVar11) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_60 = *puVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar7;
    local_70 = (ulong *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_50 = (Alloc *)&stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x02');
  *(undefined2 *)&local_50->size = 0x3438;
  uVar13 = 0xf;
  if (local_70 != &local_60) {
    uVar13 = local_60;
  }
  if (uVar13 < (ulong)(local_48 + local_68)) {
    uVar13 = 0xf;
    if (local_50 != (Alloc *)&stack0xffffffffffffffc0) {
      uVar13 = local_40;
    }
    if ((ulong)(local_48 + local_68) <= uVar13) {
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70)
      ;
      goto LAB_001c9bed;
    }
  }
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_001c9bed:
  pAVar11 = (Alloc *)(plVar5 + 2);
  if ((Alloc *)*plVar5 == pAVar11) {
    local_c0._0_8_ = pAVar11->size;
    local_c0._8_8_ = plVar5[3];
    local_d0 = (Alloc *)local_c0;
  }
  else {
    local_c0._0_8_ = pAVar11->size;
    local_d0 = (Alloc *)*plVar5;
  }
  local_c8 = (void *)plVar5[1];
  *plVar5 = (long)pAVar11;
  plVar5[1] = 0;
  *(undefined1 *)&pAVar11->size = 0;
  begin_code("parallel_for",(char *)local_d0);
  if (local_d0 != (Alloc *)local_c0) {
    operator_delete(local_d0,(ulong)((long)(size_t *)local_c0._0_8_ + 1));
  }
  if (local_50 != (Alloc *)&stack0xffffffffffffffc0) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,(ulong)((long)&local_e0[0]->size + 1));
  }
  iVar9 = (int)(uVar10 >> 2);
  if (1 < iVar9) {
    local_d0 = (Alloc *)local_a0;
    if (((ulong)local_a0 & 7) == 0 && (Alloc *)local_a0 != (Alloc *)0x0) {
      local_d0 = (Alloc *)((long)*local_a0 * 8 + 1);
    }
    local_c8 = local_98;
    local_c0._0_8_ = local_90;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      local_c0._0_8_ = local_90->size * 8 + 1;
    }
    local_c0._8_8_ = pAStack_88;
    local_c0._16_8_ = local_80;
    if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
      local_c0._16_8_ = local_80->size * 8 + 1;
    }
    local_c0._24_8_ = local_78;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      iVar3 = *(int *)((long)local_98 + lVar12 * 4);
      iVar14 = *(int *)((long)local_98 + lVar12 * 4 + 4);
      uVar13 = (ulong)iVar14;
      uVar10 = (long)iVar3;
      if (iVar3 < iVar14) {
        do {
          uVar1 = uVar10 + 1;
          iVar3 = *(int *)((long)&pAStack_88->size + uVar10 * 4);
          if ((long)uVar1 < (long)uVar13) {
            uVar15 = uVar10 & 0xffffffff;
            uVar17 = uVar1;
            iVar8 = iVar3;
            do {
              iVar4 = *(int *)((long)&pAStack_88->size + uVar17 * 4);
              if (iVar4 < iVar8) {
                uVar15 = uVar17 & 0xffffffff;
              }
              iVar14 = (int)uVar15;
              if (iVar4 <= iVar8) {
                iVar8 = iVar4;
              }
              uVar17 = uVar17 + 1;
            } while ((long)uVar17 < (long)uVar13);
          }
          else {
            iVar14 = (int)uVar10;
          }
          lVar16 = (long)iVar14;
          *(undefined4 *)((long)&pAStack_88->size + uVar10 * 4) =
               *(undefined4 *)((long)&pAStack_88->size + lVar16 * 4);
          *(int *)((long)&pAStack_88->size + lVar16 * 4) = iVar3;
          uVar2 = *(undefined1 *)((long)local_78 + uVar10);
          *(undefined1 *)((long)local_78 + uVar10) = *(undefined1 *)((long)local_78 + lVar16);
          *(undefined1 *)((long)local_78 + lVar16) = uVar2;
          uVar10 = uVar1;
        } while (uVar1 != uVar13);
      }
      lVar12 = lVar12 + 1;
    } while (iVar9 + -1 != (int)lVar12);
    sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::$_0::
    ~__0((__0 *)&local_d0);
  }
  ScopedTimer::~ScopedTimer(&local_f1);
  sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::$_0::~__0
            ((__0 *)&local_a0);
  ScopedTimer::~ScopedTimer(&local_f2);
  return;
}

Assistant:

void sort_by_high_index(
    LOs const l2lh, Write<LO> const lh2h, Write<I8> const codes) {
  OMEGA_H_TIME_FUNCTION;
  LO const nl = l2lh.size() - 1;
  auto f = OMEGA_H_LAMBDA(LO const l) {
    LO const begin = l2lh[l];
    LO const end = l2lh[l + 1];
    for (LO j = begin; j < end; ++j) {
      LO k_min = j;
      GO min_h = lh2h[j];
      for (LO k = j + 1; k < end; ++k) {
        GO const h = lh2h[k];
        if (h < min_h) {
          k_min = k;
          min_h = h;
        }
      }
      swap2(lh2h[j], lh2h[k_min]);
      swap2(codes[j], codes[k_min]);
    }
  };
  parallel_for(nl, std::move(f));
}